

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

bool test_DiskTableNode_behavior(void)

{
  allocator<SSTableDataEntry> *paVar1;
  initializer_list<SSTableDataEntry> __l;
  initializer_list<SSTableDataEntry> __l_00;
  initializer_list<SSTableDataEntry> __l_01;
  bool bVar2;
  void *this;
  SSTableDataEntry *local_658;
  SSTableDataEntry *local_638;
  SSTableDataEntry *local_618;
  SSTableDataEntry local_608;
  path local_5c8;
  undefined1 local_5a0 [8];
  DiskTableNode node4;
  undefined1 local_560 [8];
  DiskTableNode node3;
  DiskTableNode node2;
  undefined1 local_4f0 [8];
  SSTableDataEntry e;
  path local_4a8;
  undefined1 local_480 [8];
  DiskTableNode node;
  undefined1 local_440 [8];
  SSTable t;
  SSTableDataEntry local_3f0;
  SSTableDataEntry local_3b0;
  SSTableDataEntry local_370;
  iterator local_330;
  size_type local_328;
  undefined1 local_320 [8];
  SSTableData data3;
  SSTableDataEntry local_2f8;
  SSTableDataEntry local_2b8;
  SSTableDataEntry local_278;
  SSTableDataEntry local_238;
  SSTableDataEntry local_1f8;
  iterator local_1b8;
  size_type local_1b0;
  undefined1 local_1a8 [8];
  SSTableData data2;
  SSTableDataEntry local_178;
  SSTableDataEntry local_138;
  SSTableDataEntry local_f8;
  SSTableDataEntry local_b8;
  SSTableDataEntry local_78;
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  SSTableData data;
  
  SSTableDataEntry::SSTableDataEntry(&local_178,false,0xbc614e,1,"Hello,World!");
  SSTableDataEntry::SSTableDataEntry(&local_138,false,0x75bc702,2,"LLLLL");
  SSTableDataEntry::SSTableDataEntry(&local_f8,true,0x4840e3f3,3,"");
  SSTableDataEntry::SSTableDataEntry(&local_b8,false,0x75998cb,4,"NIMO");
  SSTableDataEntry::SSTableDataEntry(&local_78,false,0x497ff7f0,10,"Hello,NIMO");
  local_38 = &local_178;
  local_30 = 5;
  paVar1 = (allocator<SSTableDataEntry> *)
           ((long)&data2.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<SSTableDataEntry>::allocator(paVar1);
  __l_01._M_len = local_30;
  __l_01._M_array = local_38;
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector
            ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)local_28,__l_01,paVar1);
  std::allocator<SSTableDataEntry>::~allocator
            ((allocator<SSTableDataEntry> *)
             ((long)&data2.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  local_618 = (SSTableDataEntry *)&local_38;
  do {
    local_618 = local_618 + -1;
    SSTableDataEntry::~SSTableDataEntry(local_618);
  } while (local_618 != &local_178);
  SSTableDataEntry::SSTableDataEntry(&local_2f8,false,0xbc614e,0,"Hello,World!");
  SSTableDataEntry::SSTableDataEntry(&local_2b8,false,0x75bc702,2,"LLLLL");
  SSTableDataEntry::SSTableDataEntry(&local_278,true,0x4840e3f3,3,"");
  SSTableDataEntry::SSTableDataEntry(&local_238,false,0x75998cb,4,"NIMO");
  SSTableDataEntry::SSTableDataEntry(&local_1f8,false,0x497ff7f0,0xf,"Hello,NIMO");
  local_1b8 = &local_2f8;
  local_1b0 = 5;
  paVar1 = (allocator<SSTableDataEntry> *)
           ((long)&data3.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<SSTableDataEntry>::allocator(paVar1);
  __l_00._M_len = local_1b0;
  __l_00._M_array = local_1b8;
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector
            ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)local_1a8,__l_00,paVar1)
  ;
  std::allocator<SSTableDataEntry>::~allocator
            ((allocator<SSTableDataEntry> *)
             ((long)&data3.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_638 = (SSTableDataEntry *)&local_1b8;
  do {
    local_638 = local_638 + -1;
    SSTableDataEntry::~SSTableDataEntry(local_638);
  } while (local_638 != &local_2f8);
  SSTableDataEntry::SSTableDataEntry(&local_3f0,false,0x75bc702,2,"LLLLL");
  SSTableDataEntry::SSTableDataEntry(&local_3b0,true,0x4840e3f3,3,"");
  SSTableDataEntry::SSTableDataEntry(&local_370,false,0x75998cb,4,"NIMO");
  local_330 = &local_3f0;
  local_328 = 3;
  paVar1 = (allocator<SSTableDataEntry> *)((long)&t.index + 7);
  std::allocator<SSTableDataEntry>::allocator(paVar1);
  __l._M_len = local_328;
  __l._M_array = local_330;
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::vector
            ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)local_320,__l,paVar1);
  std::allocator<SSTableDataEntry>::~allocator((allocator<SSTableDataEntry> *)((long)&t.index + 7));
  local_658 = (SSTableDataEntry *)&local_330;
  do {
    local_658 = local_658 + -1;
    SSTableDataEntry::~SSTableDataEntry(local_658);
  } while (local_658 != &local_3f0);
  SSTable::SSTable((SSTable *)local_440);
  SSTable::fillData((SSTable *)local_440,(SSTableData *)local_28);
  std::filesystem::__cxx11::path::path<char[10],std::filesystem::__cxx11::path>
            ((path *)&node.index,(char (*) [10])"testf.bin",auto_format);
  SSTable::writeToDisk((SSTable *)local_440,(path *)&node.index);
  std::filesystem::__cxx11::path::~path((path *)&node.index);
  std::filesystem::__cxx11::path::path<char[10],std::filesystem::__cxx11::path>
            (&local_4a8,(char (*) [10])"testf.bin",auto_format);
  DiskTableNode::DiskTableNode((DiskTableNode *)local_480,&local_4a8);
  std::filesystem::__cxx11::path::~path(&local_4a8);
  bVar2 = DiskTableNode::mightIn((DiskTableNode *)local_480,0xb);
  if (bVar2) {
    data.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    e.value.field_2._12_4_ = 1;
  }
  else {
    bVar2 = DiskTableNode::mightIn((DiskTableNode *)local_480,10);
    if (bVar2) {
      bVar2 = DiskTableNode::mightIn((DiskTableNode *)local_480,5);
      this = (void *)std::ostream::operator<<(&std::cout,bVar2);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      DiskTableNode::getEntry((SSTableDataEntry *)local_4f0,(DiskTableNode *)local_480,6);
      bVar2 = DiskTableNode::valid((DiskTableNode *)local_480,(SSTableDataEntry *)local_4f0);
      if (bVar2) {
        data.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        e.value.field_2._12_4_ = 1;
      }
      else {
        DiskTableNode::getEntry((SSTableDataEntry *)&node2.index,(DiskTableNode *)local_480,4);
        SSTableDataEntry::operator=((SSTableDataEntry *)local_4f0,(SSTableDataEntry *)&node2.index);
        SSTableDataEntry::~SSTableDataEntry((SSTableDataEntry *)&node2.index);
        if ((e._0_8_ != 0x75998cb) ||
           (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&e.value_length,"NIMO"), bVar2)) {
          data.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
          e.value.field_2._12_4_ = 1;
        }
        else {
          DiskTableNode::DiskTableNode((DiskTableNode *)&node3.index);
          DiskTableNode::DiskTableNode((DiskTableNode *)local_560);
          DiskTableNode::fillData((DiskTableNode *)&node3.index,(SSTableData *)local_1a8);
          DiskTableNode::fillData((DiskTableNode *)local_560,(SSTableData *)local_320);
          bVar2 = DiskTableNode::intersect((DiskTableNode *)local_480,(DiskTableNode *)&node3.index)
          ;
          if ((bVar2) &&
             (bVar2 = DiskTableNode::intersect
                                ((DiskTableNode *)local_480,(DiskTableNode *)local_560), bVar2)) {
            std::filesystem::__cxx11::path::path<char[11],std::filesystem::__cxx11::path>
                      ((path *)&node4.index,(char (*) [11])"testf2.bin",auto_format);
            DiskTableNode::writeToDisk((DiskTableNode *)&node3.index,(path *)&node4.index);
            std::filesystem::__cxx11::path::~path((path *)&node4.index);
            std::filesystem::__cxx11::path::path<char[11],std::filesystem::__cxx11::path>
                      (&local_5c8,(char (*) [11])"testf2.bin",auto_format);
            DiskTableNode::DiskTableNode((DiskTableNode *)local_5a0,&local_5c8);
            std::filesystem::__cxx11::path::~path(&local_5c8);
            DiskTableNode::getEntry(&local_608,(DiskTableNode *)local_5a0,4);
            bVar2 = std::operator!=(&local_608.value,"NIMO");
            SSTableDataEntry::~SSTableDataEntry(&local_608);
            if (!bVar2) {
              remove("testf.bin");
              remove("testf2.bin");
            }
            data.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._7_1_ = !bVar2;
            e.value.field_2._12_4_ = 1;
            DiskTableNode::~DiskTableNode((DiskTableNode *)local_5a0);
          }
          else {
            data.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
            e.value.field_2._12_4_ = 1;
          }
          DiskTableNode::~DiskTableNode((DiskTableNode *)local_560);
          DiskTableNode::~DiskTableNode((DiskTableNode *)&node3.index);
        }
      }
      SSTableDataEntry::~SSTableDataEntry((SSTableDataEntry *)local_4f0);
    }
    else {
      data.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      e.value.field_2._12_4_ = 1;
    }
  }
  DiskTableNode::~DiskTableNode((DiskTableNode *)local_480);
  SSTable::~SSTable((SSTable *)local_440);
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector
            ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)local_320);
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector
            ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)local_1a8);
  std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::~vector
            ((vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *)local_28);
  return (bool)(data.super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage._7_1_ & 1);
}

Assistant:

bool test_DiskTableNode_behavior() {
    auto data = SSTableData{
            {false, 12345678,   1,  "Hello,World!"},
            {false, 123455234,  2,  "LLLLL"},
            {true,  1212212211, 3,  ""},
            {false, 123312331,  4,  "NIMO"},
            {false, 1233123312, 10, "Hello,NIMO"}
    };
    auto data2 = SSTableData{
            {false, 12345678,   0,  "Hello,World!"},
            {false, 123455234,  2,  "LLLLL"},
            {true,  1212212211, 3,  ""},
            {false, 123312331,  4,  "NIMO"},
            {false, 1233123312, 15, "Hello,NIMO"}
    };
    auto data3 = SSTableData{
            {false, 123455234,  2, "LLLLL"},
            {true,  1212212211, 3, ""},
            {false, 123312331,  4, "NIMO"},
    };
    auto t = SSTable{};
    t.fillData(std::move(data));
    t.writeToDisk("testf.bin");

    auto node = DiskTableNode{path{"testf.bin"}};

    if (node.mightIn(11)) {
        return false;
    }

    if (!node.mightIn(10)) {
        return false;
    }
    std::cout << node.mightIn(5) << std::endl;

    auto e = node.getEntry(6);

    if (node.valid(e)) {
        return false;
    }

    e = node.getEntry(4);

    if (e.timestamp != 123312331 || e.value != "NIMO") {
        return false;
    }

    auto node2 = DiskTableNode{};
    auto node3 = DiskTableNode{};
    node2.fillData(std::move(data2));
    node3.fillData(std::move(data3));

    if (!node.intersect(node2) || !node.intersect(node3)) {
        return false;
    }

    node2.writeToDisk("testf2.bin");

    auto node4 = DiskTableNode{path{"testf2.bin"}};

    if (node4.getEntry(4).value != "NIMO") {
        return false;
    }

    remove("testf.bin");
    remove("testf2.bin");
    return true;
}